

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[2],char_const&>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],char *params_1)

{
  undefined1 local_21;
  ArrayPtr<const_char> local_20;
  
  local_20 = toCharSequence<char_const(&)[2]>((char (*) [2])this);
  local_21 = (*params)[0];
  _::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_20,(ArrayPtr<const_char> *)&local_21,
             (FixedArray<char,_1UL> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}